

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

void __thiscall dg::pta::LLVMPointerGraphBuilder::PSNodesSeq::append(PSNodesSeq *this,PSNode *n)

{
  value_type *in_RDI;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *unaff_retaddr;
  
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void append(PSNode *n) { _nodes.push_back(n); }